

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_bigint64.c
# Opt level: O2

int main(void)

{
  uint_least32_t low;
  uint uVar1;
  _PDCLIB_bigint_t big;
  
  for (uVar1 = 0; uVar1 != 0x20; uVar1 = uVar1 + 1) {
    low = 1 << ((byte)uVar1 & 0x1f);
    _PDCLIB_bigint64(&big,0,low);
    if (big.size != (uVar1 >> 4) + 1) {
      TEST_RESULTS = TEST_RESULTS + 1;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint64.c, line %d - %s\n"
             ,0x38,"big.size == n / _PDCLIB_BIGINT_DIGIT_BITS + 1");
    }
    _PDCLIB_bigint64(&big,low,0);
    if (big.size != (uVar1 >> 4) + 3) {
      TEST_RESULTS = TEST_RESULTS + 1;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint64.c, line %d - %s\n"
             ,0x3a,"big.size == n / _PDCLIB_BIGINT_DIGIT_BITS + DIGITS_PER_32BIT + 1");
    }
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    _PDCLIB_bigint_t big;
    uint_least32_t value;
    unsigned n;

    for ( n = 0; n < 32; ++n )
    {
        value = UINT32_C( 1 ) << n;
        _PDCLIB_bigint64( &big, 0, value );
        TESTCASE( big.size == n / _PDCLIB_BIGINT_DIGIT_BITS + 1 );
        _PDCLIB_bigint64( &big, value, 0 );
        TESTCASE( big.size == n / _PDCLIB_BIGINT_DIGIT_BITS + DIGITS_PER_32BIT + 1 );
    }
#endif

    return TEST_RESULTS;
}